

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void subr_settime(LispPTR *args)

{
  LispPTR *pLVar1;
  undefined1 local_20 [8];
  timeval timev;
  LispPTR *args_local;
  
  timev.tv_usec = (__suseconds_t)args;
  pLVar1 = NativeAligned4FromLAddr(*args);
  local_20 = (undefined1  [8])(ulong)(*pLVar1 + 0x7e36b500);
  timev.tv_sec = 0;
  settimeofday((timeval *)local_20,(timezone *)0x0);
  return;
}

Assistant:

void subr_settime(LispPTR args[])
{
#ifdef DOS
  struct dostime_t dostime;
  struct dosdate_t dosday;
  struct tm uxtime;

  uxtime = *localtime((time_t *)(*((int *)NativeAligned4FromLAddr(args[0])) - UNIX_ALTO_TIME_DIFF));
  dostime.hsecond = 0;
  dostime.second = uxtime.tm_sec;
  dostime.minute = uxtime.tm_min;
  dostime.hour = uxtime.tm_hour;
  _dos_settime(&dostime);

  dosday.day = uxtime.tm_mday;
  dosday.month = uxtime.tm_mon;
  dosday.year = uxtime.tm_year;
  dosday.dayofweek = uxtime.tm_wday;
  _dos_setdate(&dosday);
#elif defined(MAIKO_OS_HAIKU)
  (void)args[0];
#elif defined(MAIKO_OS_EMSCRIPTEN)
  (void)args[0];
#else
  struct timeval timev;
  timev.tv_sec = *((int *)NativeAligned4FromLAddr(args[0])) - UNIX_ALTO_TIME_DIFF;
  timev.tv_usec = 0;
  settimeofday(&timev, NULL);
#endif
}